

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O0

Validity * __thiscall
capnp::compiler::CompilerMain::evalConst
          (Validity *__return_storage_ptr__,CompilerMain *this,StringPtr name)

{
  ProcessContext *pPVar1;
  Reader brand;
  Reader reader;
  Reader value_00;
  Reader value_01;
  StringPtr name_00;
  bool bVar2;
  undefined8 uVar3;
  Which WVar4;
  Format FVar5;
  Type TVar6;
  uint uVar7;
  int iVar8;
  size_t sVar9;
  char *begin;
  char *end;
  NullableValue<kj::Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>_> *other;
  Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> *pAVar10;
  Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> *pAVar11;
  SourceFile *pSVar12;
  Tuple<kj::String,_kj::Array<unsigned_long>_> *pTVar13;
  TypeByIndex<0UL,_kj::String,_kj::Array<unsigned_long>_> *pTVar14;
  Compiler *pCVar15;
  NullableValue<unsigned_long> *other_00;
  unsigned_long *puVar16;
  TypeByIndex<1UL,_kj::String,_kj::Array<unsigned_long>_> *pTVar17;
  SchemaLoader *this_00;
  NullableValue<capnp::StructSchema::Field> *other_01;
  Field *pFVar18;
  Field *pFVar19;
  Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::ExactlyConst_<char,__x_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_true>_>,_kj::parse::_::ParseInteger<16U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<8U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<10U>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>
  *subParsers_1;
  OneOf_<const_kj::parse::EndOfInput__&,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::NotLookingAt_<const_kj::parse::EndOfInput__&>_>_>
  *__return_storage_ptr___00;
  Sequence_<kj::parse::ExactlyConst_<char,__[_>,_const_kj::parse::Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::ExactlyConst_<char,__x_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_true>_>,_kj::parse::_::ParseInteger<16U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<8U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<10U>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>_&,_kj::parse::ExactlyConst_<char,__]_>_>
  *subParser;
  Sequence_<const_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::IdentifierToString>_&,_kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__[_>,_const_kj::parse::Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::ExactlyConst_<char,__x_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_true>_>,_kj::parse::_::ParseInteger<16U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<8U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<10U>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>_&,_kj::parse::ExactlyConst_<char,__]_>_>,_false>,_kj::parse::OneOf_<const_kj::parse::EndOfInput__&,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::NotLookingAt_<const_kj::parse::EndOfInput__&>_>_>_>
  *subParser_00;
  Reader *extraout_RDX;
  Reader *extraout_RDX_00;
  Reader *extraout_RDX_01;
  Reader *params;
  OneOf_<const_kj::parse::EndOfInput__&,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::NotLookingAt_<const_kj::parse::EndOfInput__&>_>_>
  *in_R8;
  ArrayPtr<capnp::word> AVar20;
  ArrayPtr<const_capnp::word> AVar21;
  StringPtr SVar22;
  ReaderOptions options;
  RawBrandedSchema *params_4;
  undefined8 in_stack_fffffffffffff2e0;
  undefined8 in_stack_fffffffffffff2e8;
  String local_ae8;
  StringPtr local_ad0;
  ReaderFor<capnp::DynamicList> local_ac0;
  StringTree local_a80;
  String local_a48;
  StringPtr local_a30;
  ReaderFor<capnp::DynamicStruct> local_a20;
  StringTree local_9e8;
  String local_9b0;
  StringPtr local_998;
  Reader local_988;
  undefined1 local_958 [8];
  FdOutputStream output;
  undefined1 local_938 [8];
  ReaderFor<capnp::DynamicStruct> structValue_1;
  ArrayPtr<unsigned_long> local_8e8;
  String local_8d8;
  String local_8c0;
  ArrayPtr<unsigned_long> local_8a8;
  String local_898;
  String local_880;
  Reader local_868;
  undefined1 local_820 [8];
  ReaderFor<capnp::DynamicList> listValue;
  uint64_t subscript;
  uint i;
  TypeByIndex<1UL,_kj::String,_kj::Array<unsigned_long>_> *subscripts;
  String local_7b0;
  RawBrandedSchema *local_798;
  undefined8 uStack_790;
  SegmentReader *local_788;
  CapTableReader *pCStack_780;
  void *local_778;
  WirePointer *pWStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  Reader local_750;
  int local_708;
  undefined4 uStack_704;
  char *pcStack_700;
  Schema local_6f0;
  Maybe<capnp::StructSchema::Field> local_6e8;
  undefined1 local_6a0 [8];
  NullableValue<capnp::StructSchema::Field> field;
  ReaderFor<capnp::DynamicStruct> structValue;
  StringPtr partName;
  String local_600;
  String local_5e8;
  ArrayPtr<const_char> local_5d0;
  String local_5c0;
  Schema local_5a8;
  Reader local_5a0;
  Reader local_568;
  ArrayPtr<const_char> local_520;
  String local_510;
  Schema local_4f8;
  Reader local_4f0;
  Reader local_4a8;
  ReaderOptions local_478;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> local_460;
  undefined1 local_450 [8];
  SegmentArrayMessageReader emptyMessage;
  undefined1 local_358 [8];
  ArrayPtr<const_capnp::word> segments [1];
  word local_340;
  word zeroWord [1];
  Reader value;
  Reader local_2e8;
  Schema local_2b0;
  Schema schema;
  undefined1 local_290 [16];
  undefined1 local_280 [8];
  NullableValue<unsigned_long> childId;
  StringPtr part;
  Maybe<kj::_::Mutex::Waiter_&> MStack_258;
  bool stoppedAtSubscript;
  uint64_t scopeId;
  Tuple<kj::String,_kj::Array<unsigned_long>_> *pos;
  Maybe<kj::Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>_> local_240;
  undefined1 local_220 [8];
  NullableValue<kj::Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>_> p;
  Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> nameParts;
  IteratorInput<char,_const_char_*> input;
  parse local_1b9;
  EndOfInput_ local_1b8 [24];
  OneOf_<const_kj::parse::EndOfInput__&,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::NotLookingAt_<const_kj::parse::EndOfInput__&>_>_>
  local_1a0;
  undefined1 local_173 [3];
  parse local_170 [24];
  undefined1 local_158 [104];
  parse local_f0 [80];
  undefined1 local_a0 [8];
  Sequence_<kj::parse::Many_<kj::parse::Sequence_<const_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::IdentifierToString>_&,_kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__[_>,_const_kj::parse::Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::ExactlyConst_<char,__x_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_true>_>,_kj::parse::_::ParseInteger<16U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<8U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<10U>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>_&,_kj::parse::ExactlyConst_<char,__]_>_>,_false>,_kj::parse::OneOf_<const_kj::parse::EndOfInput__&,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::NotLookingAt_<const_kj::parse::EndOfInput__&>_>_>_>,_false>,_const_kj::parse::EndOfInput__&>
  parser;
  Fault local_30;
  Fault f;
  CompilerMain *this_local;
  StringPtr name_local;
  int *params_2;
  
  name_local.content.ptr = (char *)name.content.size_;
  this_local = (CompilerMain *)name.content.ptr;
  f.exception = (Exception *)this;
  name_local.content.size_ = (size_t)__return_storage_ptr__;
  FVar5 = formatFromDeprecatedFlags(this,this->convertTo);
  this->convertTo = FVar5;
  sVar9 = kj::Vector<capnp::compiler::CompilerMain::SourceFile>::size(&this->sourceFiles);
  if (sVar9 != 1) {
    kj::_::Debug::Fault::Fault
              (&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/capnp.c++"
               ,0x641,FAILED,"sourceFiles.size() == 1","");
    kj::_::Debug::Fault::fatal(&local_30);
  }
  kj::parse::exactChar<(char)91>();
  kj::parse::exactChar<(char)93>();
  subParsers_1 = (Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::ExactlyConst_<char,__x_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_true>_>,_kj::parse::_::ParseInteger<16U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<8U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<10U>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>
                  *)local_173;
  kj::parse::
  sequence<kj::parse::ExactlyConst_<char,(char)91>,kj::parse::Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)48>,kj::parse::ExactlyConst_<char,(char)120>,kj::parse::Many_<kj::parse::CharGroup_const&,true>>,kj::parse::_::ParseInteger<16u>>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)48>,kj::parse::Many_<kj::parse::CharGroup_const&,false>>,kj::parse::_::ParseInteger<8u>>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,kj::parse::Many_<kj::parse::CharGroup_const&,false>>,kj::parse::_::ParseInteger<10u>>>,kj::parse::NotLookingAt_<kj::parse::CharGroup_>>const&,kj::parse::ExactlyConst_<char,(char)93>>
            ((Sequence_<kj::parse::ExactlyConst_<char,__[_>,_const_kj::parse::Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::ExactlyConst_<char,__x_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_true>_>,_kj::parse::_::ParseInteger<16U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<8U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<10U>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>_&,_kj::parse::ExactlyConst_<char,__]_>_>
              *)local_170,(parse *)(local_173 + 2),(ExactlyConst_<char,__[_> *)kj::parse::integer,
             subParsers_1,(ExactlyConst_<char,__]_> *)in_R8);
  kj::parse::
  many<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)91>,kj::parse::Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)48>,kj::parse::ExactlyConst_<char,(char)120>,kj::parse::Many_<kj::parse::CharGroup_const&,true>>,kj::parse::_::ParseInteger<16u>>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)48>,kj::parse::Many_<kj::parse::CharGroup_const&,false>>,kj::parse::_::ParseInteger<8u>>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,kj::parse::Many_<kj::parse::CharGroup_const&,false>>,kj::parse::_::ParseInteger<10u>>>,kj::parse::NotLookingAt_<kj::parse::CharGroup_>>const&,kj::parse::ExactlyConst_<char,(char)93>>>
            ((Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__[_>,_const_kj::parse::Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::ExactlyConst_<char,__x_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_true>_>,_kj::parse::_::ParseInteger<16U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<8U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<10U>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>_&,_kj::parse::ExactlyConst_<char,__]_>_>,_false>
              *)local_158,local_170,subParser);
  kj::parse::exactChar<(char)46>();
  input.best = (char *)kj::parse::notLookingAt<kj::parse::EndOfInput_const&>
                                 ((EndOfInput_ *)&kj::parse::endOfInput);
  kj::parse::
  sequence<kj::parse::ExactlyConst_<char,(char)46>,kj::parse::NotLookingAt_<kj::parse::EndOfInput_const&>>
            ((Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::NotLookingAt_<const_kj::parse::EndOfInput__&>_>
              *)local_1b8,&local_1b9,(ExactlyConst_<char,____> *)&input.best,
             (NotLookingAt_<const_kj::parse::EndOfInput__&> *)subParsers_1);
  __return_storage_ptr___00 = &local_1a0;
  kj::parse::
  oneOf<kj::parse::EndOfInput_const&,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)46>,kj::parse::NotLookingAt_<kj::parse::EndOfInput_const&>>>
            (__return_storage_ptr___00,(parse *)&kj::parse::endOfInput,local_1b8,
             (Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::NotLookingAt_<const_kj::parse::EndOfInput__&>_>
              *)subParsers_1);
  kj::parse::
  sequence<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_const&,kj::parse::Many_<kj::parse::CharGroup_const&,false>>,kj::parse::_::IdentifierToString>const&,kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)91>,kj::parse::Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)48>,kj::parse::ExactlyConst_<char,(char)120>,kj::parse::Many_<kj::parse::CharGroup_const&,true>>,kj::parse::_::ParseInteger<16u>>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)48>,kj::parse::Many_<kj::parse::CharGroup_const&,false>>,kj::parse::_::ParseInteger<8u>>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,kj::parse::Many_<kj::parse::CharGroup_const&,false>>,kj::parse::_::ParseInteger<10u>>>,kj::parse::NotLookingAt_<kj::parse::CharGroup_>>const&,kj::parse::ExactlyConst_<char,(char)93>>,false>,kj::parse::OneOf_<kj::parse::EndOfInput_const&,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)46>,kj::parse::NotLookingAt_<kj::parse::EndOfInput_const&>>>>
            ((Sequence_<const_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::IdentifierToString>_&,_kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__[_>,_const_kj::parse::Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::ExactlyConst_<char,__x_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_true>_>,_kj::parse::_::ParseInteger<16U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<8U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<10U>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>_&,_kj::parse::ExactlyConst_<char,__]_>_>,_false>,_kj::parse::OneOf_<const_kj::parse::EndOfInput__&,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::NotLookingAt_<const_kj::parse::EndOfInput__&>_>_>_>
              *)(local_158 + 0x18),(parse *)kj::parse::identifier,
             (Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::IdentifierToString>
              *)local_158,
             (Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__[_>,_const_kj::parse::Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::ExactlyConst_<char,__x_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_true>_>,_kj::parse::_::ParseInteger<16U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<8U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<10U>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>_&,_kj::parse::ExactlyConst_<char,__]_>_>,_false>
              *)__return_storage_ptr___00,in_R8);
  kj::parse::
  many<kj::parse::Sequence_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_const&,kj::parse::Many_<kj::parse::CharGroup_const&,false>>,kj::parse::_::IdentifierToString>const&,kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)91>,kj::parse::Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)48>,kj::parse::ExactlyConst_<char,(char)120>,kj::parse::Many_<kj::parse::CharGroup_const&,true>>,kj::parse::_::ParseInteger<16u>>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)48>,kj::parse::Many_<kj::parse::CharGroup_const&,false>>,kj::parse::_::ParseInteger<8u>>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,kj::parse::Many_<kj::parse::CharGroup_const&,false>>,kj::parse::_::ParseInteger<10u>>>,kj::parse::NotLookingAt_<kj::parse::CharGroup_>>const&,kj::parse::ExactlyConst_<char,(char)93>>,false>,kj::parse::OneOf_<kj::parse::EndOfInput_const&,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)46>,kj::parse::NotLookingAt_<kj::parse::EndOfInput_const&>>>>>
            ((Many_<kj::parse::Sequence_<const_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::IdentifierToString>_&,_kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__[_>,_const_kj::parse::Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::ExactlyConst_<char,__x_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_true>_>,_kj::parse::_::ParseInteger<16U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<8U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<10U>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>_&,_kj::parse::ExactlyConst_<char,__]_>_>,_false>,_kj::parse::OneOf_<const_kj::parse::EndOfInput__&,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::NotLookingAt_<const_kj::parse::EndOfInput__&>_>_>_>,_false>
              *)local_f0,(parse *)(local_158 + 0x18),subParser_00);
  kj::parse::
  sequence<kj::parse::Many_<kj::parse::Sequence_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_const&,kj::parse::Many_<kj::parse::CharGroup_const&,false>>,kj::parse::_::IdentifierToString>const&,kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)91>,kj::parse::Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)48>,kj::parse::ExactlyConst_<char,(char)120>,kj::parse::Many_<kj::parse::CharGroup_const&,true>>,kj::parse::_::ParseInteger<16u>>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)48>,kj::parse::Many_<kj::parse::CharGroup_const&,false>>,kj::parse::_::ParseInteger<8u>>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,kj::parse::Many_<kj::parse::CharGroup_const&,false>>,kj::parse::_::ParseInteger<10u>>>,kj::parse::NotLookingAt_<kj::parse::CharGroup_>>const&,kj::parse::ExactlyConst_<char,(char)93>>,false>,kj::parse::OneOf_<kj::parse::EndOfInput_const&,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)46>,kj::parse::NotLookingAt_<kj::parse::EndOfInput_const&>>>>,false>,kj::parse::EndOfInput_const&>
            ((Sequence_<kj::parse::Many_<kj::parse::Sequence_<const_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::IdentifierToString>_&,_kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__[_>,_const_kj::parse::Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::ExactlyConst_<char,__x_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_true>_>,_kj::parse::_::ParseInteger<16U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<8U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<10U>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>_&,_kj::parse::ExactlyConst_<char,__]_>_>,_false>,_kj::parse::OneOf_<const_kj::parse::EndOfInput__&,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::NotLookingAt_<const_kj::parse::EndOfInput__&>_>_>_>,_false>,_const_kj::parse::EndOfInput__&>
              *)local_a0,local_f0,
             (Many_<kj::parse::Sequence_<const_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::IdentifierToString>_&,_kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__[_>,_const_kj::parse::Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::ExactlyConst_<char,__x_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_true>_>,_kj::parse::_::ParseInteger<16U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<8U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<10U>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>_&,_kj::parse::ExactlyConst_<char,__]_>_>,_false>,_kj::parse::OneOf_<const_kj::parse::EndOfInput__&,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::NotLookingAt_<const_kj::parse::EndOfInput__&>_>_>_>,_false>
              *)&kj::parse::endOfInput,(EndOfInput_ *)__return_storage_ptr___00);
  begin = kj::StringPtr::begin((StringPtr *)&this_local);
  end = kj::StringPtr::end((StringPtr *)&this_local);
  kj::parse::IteratorInput<char,_const_char_*>::IteratorInput
            ((IteratorInput<char,_const_char_*> *)&nameParts.disposer,begin,end);
  kj::Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>::Array
            ((Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> *)
             ((long)&p.field_1 + 0x10));
  kj::parse::
  Sequence_<kj::parse::Many_<kj::parse::Sequence_<const_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::IdentifierToString>_&,_kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'['>,_const_kj::parse::Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'0'>,_kj::parse::ExactlyConst_<char,_'x'>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_true>_>,_kj::parse::_::ParseInteger<16U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'0'>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<8U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<10U>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>_&,_kj::parse::ExactlyConst_<char,_']'>_>,_false>,_kj::parse::OneOf_<const_kj::parse::EndOfInput__&,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'.'>,_kj::parse::NotLookingAt_<const_kj::parse::EndOfInput__&>_>_>_>,_false>,_const_kj::parse::EndOfInput__&>
  ::operator()<kj::parse::IteratorInput<char,_const_char_*>_>
            (&local_240,
             (Sequence_<kj::parse::Many_<kj::parse::Sequence_<const_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::IdentifierToString>_&,_kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__[_>,_const_kj::parse::Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::ExactlyConst_<char,__x_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_true>_>,_kj::parse::_::ParseInteger<16U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<8U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<10U>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>_&,_kj::parse::ExactlyConst_<char,__]_>_>,_false>,_kj::parse::OneOf_<const_kj::parse::EndOfInput__&,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::NotLookingAt_<const_kj::parse::EndOfInput__&>_>_>_>,_false>,_const_kj::parse::EndOfInput__&>
              *)local_a0,(IteratorInput<char,_const_char_*> *)&nameParts.disposer);
  other = kj::_::readMaybe<kj::Array<kj::_::Tuple<kj::String,kj::Array<unsigned_long>>>>(&local_240)
  ;
  kj::_::NullableValue<kj::Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>_>::
  NullableValue((NullableValue<kj::Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>_> *)
                local_220,other);
  kj::Maybe<kj::Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>_>::~Maybe(&local_240);
  pAVar10 = kj::_::NullableValue::operator_cast_to_Array_((NullableValue *)local_220);
  if (pAVar10 == (Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> *)0x0) {
    kj::MainBuilder::Validity::Validity(__return_storage_ptr__,"invalid syntax");
  }
  else {
    pAVar11 = kj::_::NullableValue<kj::Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>_>
              ::operator*((NullableValue<kj::Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>_>
                           *)local_220);
    pAVar11 = kj::mv<kj::Array<kj::_::Tuple<kj::String,kj::Array<unsigned_long>>>>(pAVar11);
    kj::Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>::operator=
              ((Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> *)
               ((long)&p.field_1 + 0x10),pAVar11);
  }
  kj::_::NullableValue<kj::Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>_>::
  ~NullableValue((NullableValue<kj::Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>_> *)
                 local_220);
  if (pAVar10 == (Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> *)0x0)
  goto LAB_0033702f;
  scopeId = (uint64_t)
            kj::Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>::begin
                      ((Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> *)
                       ((long)&p.field_1 + 0x10));
  pSVar12 = kj::Vector<capnp::compiler::CompilerMain::SourceFile>::operator[](&this->sourceFiles,0);
  MStack_258.ptr = (Waiter *)pSVar12->id;
  bVar2 = false;
  for (; pTVar13 = kj::Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>::end
                             ((Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> *)
                              ((long)&p.field_1 + 0x10)),
      (Tuple<kj::String,_kj::Array<unsigned_long>_> *)scopeId != pTVar13; scopeId = scopeId + 0x30)
  {
    pTVar14 = kj::get<0ul,kj::_::Tuple<kj::String,kj::Array<unsigned_long>>&>
                        ((Tuple<kj::String,_kj::Array<unsigned_long>_> *)scopeId);
    kj::StringPtr::StringPtr((StringPtr *)&childId.field_1,pTVar14);
    pCVar15 = kj::Own<capnp::compiler::Compiler>::operator->(&this->compiler);
    schema.raw = (RawBrandedSchema *)childId.field_1;
    SVar22.content.size_ = childId.field_1.value;
    SVar22.content.ptr = (char *)MStack_258.ptr;
    Compiler::lookup((Compiler *)local_290,(uint64_t)pCVar15,SVar22);
    other_00 = kj::_::readMaybe<unsigned_long>((Maybe<unsigned_long> *)local_290);
    kj::_::NullableValue<unsigned_long>::NullableValue
              ((NullableValue<unsigned_long> *)local_280,other_00);
    kj::Maybe<unsigned_long>::~Maybe((Maybe<unsigned_long> *)local_290);
    puVar16 = kj::_::NullableValue::operator_cast_to_unsigned_long_((NullableValue *)local_280);
    if (puVar16 == (unsigned_long *)0x0) {
      pos._4_4_ = 5;
    }
    else {
      puVar16 = kj::_::NullableValue<unsigned_long>::operator*
                          ((NullableValue<unsigned_long> *)local_280);
      MStack_258.ptr = (Waiter *)*puVar16;
      pTVar17 = kj::get<1ul,kj::_::Tuple<kj::String,kj::Array<unsigned_long>>&>
                          ((Tuple<kj::String,_kj::Array<unsigned_long>_> *)scopeId);
      sVar9 = kj::Array<unsigned_long>::size(pTVar17);
      if (sVar9 == 0) {
        pos._4_4_ = 0;
      }
      else {
        bVar2 = true;
        pos._4_4_ = 5;
      }
    }
    kj::_::NullableValue<unsigned_long>::~NullableValue((NullableValue<unsigned_long> *)local_280);
    if (pos._4_4_ != 0) break;
  }
  pCVar15 = kj::Own<capnp::compiler::Compiler>::operator->(&this->compiler);
  this_00 = Compiler::getLoader(pCVar15);
  local_2e8._reader.dataSize = 0;
  local_2e8._reader.pointerCount = 0;
  local_2e8._reader._38_2_ = 0;
  local_2e8._reader.nestingLimit = 0;
  local_2e8._reader._44_4_ = 0;
  local_2e8._reader.data = (void *)0x0;
  local_2e8._reader.pointers = (WirePointer *)0x0;
  local_2e8._reader.segment = (SegmentReader *)0x0;
  local_2e8._reader.capTable = (CapTableReader *)0x0;
  capnp::schema::Brand::Reader::Reader(&local_2e8);
  Schema::Schema((Schema *)&value.field_1.listValue.reader.nestingLimit);
  brand._reader.capTable = local_2e8._reader.capTable;
  brand._reader.segment = local_2e8._reader.segment;
  brand._reader.data = local_2e8._reader.data;
  brand._reader.pointers = local_2e8._reader.pointers;
  brand._reader.dataSize = local_2e8._reader.dataSize;
  brand._reader.pointerCount = local_2e8._reader.pointerCount;
  brand._reader._38_2_ = local_2e8._reader._38_2_;
  brand._reader.nestingLimit = local_2e8._reader.nestingLimit;
  brand._reader._44_4_ = local_2e8._reader._44_4_;
  params_4 = (RawBrandedSchema *)local_2e8._reader.segment;
  local_2b0 = SchemaLoader::get(this_00,(uint64_t)MStack_258.ptr,brand,(Schema)value.field_1._56_8_)
  ;
  DynamicValue::Reader::Reader((Reader *)zeroWord,(nullptr_t)0x0);
  local_340.content = 0;
  AVar20 = kj::arrayPtr<capnp::word>(&local_340,1);
  emptyMessage.segments.size_ = (size_t)AVar20.ptr;
  AVar21 = kj::ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)&emptyMessage.segments.size_);
  segments[0].ptr = (word *)AVar21.size_;
  local_358 = (undefined1  [8])AVar21.ptr;
  kj::ArrayPtr<kj::ArrayPtr<capnp::word_const>const>::ArrayPtr<1ul>
            ((ArrayPtr<kj::ArrayPtr<capnp::word_const>const> *)&local_460,
             (ArrayPtr<const_capnp::word> (*) [1])local_358);
  local_478.traversalLimitInWords = 0;
  local_478.nestingLimit = 0;
  local_478._12_4_ = 0;
  ReaderOptions::ReaderOptions(&local_478);
  options.nestingLimit = local_478.nestingLimit;
  options.traversalLimitInWords = local_478.traversalLimitInWords;
  options._12_4_ = 0;
  params_2 = (int *)(ulong)(uint)local_478.nestingLimit;
  SegmentArrayMessageReader::SegmentArrayMessageReader
            ((SegmentArrayMessageReader *)local_450,local_460,options);
  Schema::getProto(&local_4a8,&local_2b0);
  WVar4 = capnp::schema::Node::Reader::which(&local_4a8);
  if (WVar4 == STRUCT) {
    pTVar13 = kj::Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>::end
                        ((Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> *)
                         ((long)&p.field_1 + 0x10));
    if ((Tuple<kj::String,_kj::Array<unsigned_long>_> *)scopeId != pTVar13) {
      local_5a8.raw = (RawBrandedSchema *)Schema::asStruct(&local_2b0);
      MessageReader::getRoot<capnp::DynamicStruct,capnp::StructSchema>
                (&local_5a0,(MessageReader *)local_450,(StructSchema)local_5a8.raw);
      DynamicValue::Reader::Reader(&local_568,&local_5a0);
      DynamicValue::Reader::operator=((Reader *)zeroWord,&local_568);
      DynamicValue::Reader::~Reader(&local_568);
      goto LAB_00336455;
    }
    local_520 = (ArrayPtr<const_char>)Schema::getShortDisplayName(&local_2b0);
    kj::str<char_const(&)[2],kj::StringPtr,char_const(&)[23]>
              (&local_510,(kj *)0x538fb3,(char (*) [2])&local_520,
               (StringPtr *)"\' cannot be evaluated.",(char (*) [23])params_2);
    kj::MainBuilder::Validity::Validity(__return_storage_ptr__,&local_510);
    kj::String::~String(&local_510);
  }
  else if (WVar4 == CONST) {
    local_4f8.raw = (RawBrandedSchema *)Schema::asConst(&local_2b0);
    DynamicValue::Reader::Reader(&local_4f0,(ConstSchema)local_4f8.raw);
    DynamicValue::Reader::operator=((Reader *)zeroWord,&local_4f0);
    DynamicValue::Reader::~Reader(&local_4f0);
LAB_00336455:
    for (; pTVar13 = kj::Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>::end
                               ((Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> *)
                                ((long)&p.field_1 + 0x10)),
        (Tuple<kj::String,_kj::Array<unsigned_long>_> *)scopeId != pTVar13; scopeId = scopeId + 0x30
        ) {
      pTVar14 = kj::get<0ul,kj::_::Tuple<kj::String,kj::Array<unsigned_long>>&>
                          ((Tuple<kj::String,_kj::Array<unsigned_long>_> *)scopeId);
      kj::StringPtr::StringPtr((StringPtr *)&structValue.reader.nestingLimit,pTVar14);
      if (!bVar2) {
        TVar6 = DynamicValue::Reader::getType((Reader *)zeroWord);
        if (TVar6 != STRUCT) {
          pTVar14 = kj::get<0ul,kj::_::Tuple<kj::String,kj::Array<unsigned_long>>&>
                              ((Tuple<kj::String,_kj::Array<unsigned_long>_> *)(scopeId - 0x30));
          kj::str<char_const(&)[2],kj::String&,char_const(&)[19]>
                    ((String *)&subscripts,(kj *)0x538fb3,(char (*) [2])pTVar14,
                     (String *)"\' is not a struct.",(char (*) [19])params_2);
          kj::MainBuilder::Validity::Validity(__return_storage_ptr__,(String *)&subscripts);
          kj::String::~String((String *)&subscripts);
          goto LAB_00336ff1;
        }
        DynamicValue::Reader::as<capnp::DynamicStruct>
                  ((ReaderFor<capnp::DynamicStruct> *)
                   &field.field_1.value.proto._reader.nestingLimit,(Reader *)zeroWord);
        local_6f0.raw =
             (RawBrandedSchema *)
             DynamicStruct::Reader::getSchema
                       ((Reader *)&field.field_1.value.proto._reader.nestingLimit);
        local_708 = structValue.reader.nestingLimit;
        uStack_704 = structValue.reader._44_4_;
        pcStack_700 = partName.content.ptr;
        name_00.content.size_ = (size_t)partName.content.ptr;
        name_00.content.ptr = (char *)structValue.reader._40_8_;
        StructSchema::findFieldByName(&local_6e8,(StructSchema *)&local_6f0,name_00);
        other_01 = kj::_::readMaybe<capnp::StructSchema::Field>(&local_6e8);
        kj::_::NullableValue<capnp::StructSchema::Field>::NullableValue
                  ((NullableValue<capnp::StructSchema::Field> *)local_6a0,other_01);
        kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_6e8);
        pFVar18 = kj::_::NullableValue::operator_cast_to_Field_((NullableValue *)local_6a0);
        if (pFVar18 == (Field *)0x0) {
          pTVar14 = kj::get<0ul,kj::_::Tuple<kj::String,kj::Array<unsigned_long>>&>
                              ((Tuple<kj::String,_kj::Array<unsigned_long>_> *)(scopeId - 0x30));
          params_2 = &structValue.reader.nestingLimit;
          kj::str<char_const(&)[2],kj::String&,char_const(&)[18],kj::StringPtr&,char_const(&)[3]>
                    (&local_7b0,(kj *)0x538fb3,(char (*) [2])pTVar14,(String *)"\' has no member \'"
                     ,(char (*) [18])params_2,(StringPtr *)0x52e84e,(char (*) [3])params_4);
          kj::MainBuilder::Validity::Validity(__return_storage_ptr__,&local_7b0);
          kj::String::~String(&local_7b0);
        }
        else {
          pFVar19 = kj::_::NullableValue<capnp::StructSchema::Field>::operator*
                              ((NullableValue<capnp::StructSchema::Field> *)local_6a0);
          params_4 = (pFVar19->parent).super_Schema.raw;
          uStack_790 = *(undefined8 *)&pFVar19->index;
          local_788 = (pFVar19->proto)._reader.segment;
          pCStack_780 = (pFVar19->proto)._reader.capTable;
          local_778 = (pFVar19->proto)._reader.data;
          pWStack_770 = (pFVar19->proto)._reader.pointers;
          local_768._0_4_ = (pFVar19->proto)._reader.dataSize;
          local_768._4_2_ = (pFVar19->proto)._reader.pointerCount;
          local_768._6_2_ = *(undefined2 *)&(pFVar19->proto)._reader.field_0x26;
          in_stack_fffffffffffff2e0 = *(undefined8 *)&(pFVar19->proto)._reader.nestingLimit;
          local_798 = params_4;
          uStack_760 = in_stack_fffffffffffff2e0;
          DynamicStruct::Reader::get
                    (&local_750,(Reader *)&field.field_1.value.proto._reader.nestingLimit,*pFVar19);
          DynamicValue::Reader::operator=((Reader *)zeroWord,&local_750);
          DynamicValue::Reader::~Reader(&local_750);
        }
        kj::_::NullableValue<capnp::StructSchema::Field>::~NullableValue
                  ((NullableValue<capnp::StructSchema::Field> *)local_6a0);
        if (pFVar18 == (Field *)0x0) goto LAB_00336ff1;
      }
      pTVar17 = kj::get<1ul,kj::_::Tuple<kj::String,kj::Array<unsigned_long>>&>
                          ((Tuple<kj::String,_kj::Array<unsigned_long>_> *)scopeId);
      for (subscript._4_4_ = 0; sVar9 = kj::Array<unsigned_long>::size(pTVar17),
          subscript._4_4_ < sVar9; subscript._4_4_ = subscript._4_4_ + 1) {
        puVar16 = kj::Array<unsigned_long>::operator[](pTVar17,(ulong)subscript._4_4_);
        listValue.reader._40_8_ = *puVar16;
        TVar6 = DynamicValue::Reader::getType((Reader *)zeroWord);
        if (TVar6 != LIST) {
          if (subscript._4_4_ == 0) {
            kj::str<char_const(&)[2],kj::StringPtr&,char_const(&)[17]>
                      ((String *)&structValue_1.reader.nestingLimit,(kj *)0x538fb3,
                       (char (*) [2])&structValue.reader.nestingLimit,(StringPtr *)0x52835d,
                       (char (*) [17])params_2);
            kj::MainBuilder::Validity::Validity
                      (__return_storage_ptr__,(String *)&structValue_1.reader.nestingLimit);
            kj::String::~String((String *)&structValue_1.reader.nestingLimit);
          }
          else {
            local_8e8 = kj::Array<unsigned_long>::slice(pTVar17,0,(ulong)subscript._4_4_);
            kj::strArray<kj::ArrayPtr<unsigned_long>>
                      (&local_8d8,(kj *)&local_8e8,(ArrayPtr<unsigned_long> *)"][",
                       (char *)local_8e8.ptr);
            kj::str<char_const(&)[2],kj::StringPtr&,char_const(&)[2],kj::String,char_const(&)[18]>
                      (&local_8c0,(kj *)0x538fb3,(char (*) [2])&structValue.reader.nestingLimit,
                       (StringPtr *)0x528345,(char (*) [2])&local_8d8,(String *)"]\' is not a list."
                       ,(char (*) [18])params_4);
            kj::MainBuilder::Validity::Validity(__return_storage_ptr__,&local_8c0);
            kj::String::~String(&local_8c0);
            kj::String::~String(&local_8d8);
          }
          goto LAB_00336ff1;
        }
        DynamicValue::Reader::as<capnp::DynamicList>
                  ((ReaderFor<capnp::DynamicList> *)local_820,(Reader *)zeroWord);
        uVar3 = listValue.reader._40_8_;
        uVar7 = DynamicList::Reader::size((Reader *)local_820);
        if ((ulong)uVar7 <= (ulong)uVar3) {
          local_8a8 = kj::Array<unsigned_long>::slice(pTVar17,0,(ulong)(subscript._4_4_ + 1));
          kj::strArray<kj::ArrayPtr<unsigned_long>>
                    (&local_898,(kj *)&local_8a8,(ArrayPtr<unsigned_long> *)"][",
                     (char *)local_8a8.ptr);
          kj::str<char_const(&)[2],kj::StringPtr&,char_const(&)[2],kj::String,char_const(&)[21]>
                    (&local_880,(kj *)0x538fb3,(char (*) [2])&structValue.reader.nestingLimit,
                     (StringPtr *)0x528345,(char (*) [2])&local_898,
                     (String *)"]\' is out-of-bounds.",(char (*) [21])params_4);
          kj::MainBuilder::Validity::Validity(__return_storage_ptr__,&local_880);
          kj::String::~String(&local_880);
          kj::String::~String(&local_898);
          goto LAB_00336ff1;
        }
        DynamicList::Reader::operator[]
                  (&local_868,(Reader *)local_820,listValue.reader.nestingLimit);
        DynamicValue::Reader::operator=((Reader *)zeroWord,&local_868);
        DynamicValue::Reader::~Reader(&local_868);
      }
      bVar2 = false;
    }
    if (this->convertTo == TEXT) {
      params = extraout_RDX;
      if (((this->pretty & 1U) == 0) ||
         (TVar6 = DynamicValue::Reader::getType((Reader *)zeroWord), params = extraout_RDX_00,
         TVar6 != STRUCT)) {
        if (((this->pretty & 1U) == 0) ||
           (TVar6 = DynamicValue::Reader::getType((Reader *)zeroWord), params = extraout_RDX_01,
           TVar6 != LIST)) {
          pPVar1 = this->context;
          kj::str<capnp::DynamicValue::Reader&>(&local_ae8,(kj *)zeroWord,params);
          kj::StringPtr::StringPtr(&local_ad0,&local_ae8);
          iVar8 = (*pPVar1->_vptr_ProcessContext[5])
                            (pPVar1,local_ad0.content.ptr,local_ad0.content.size_);
          kj::String::~String(&local_ae8);
        }
        else {
          pPVar1 = this->context;
          DynamicValue::Reader::as<capnp::DynamicList>(&local_ac0,(Reader *)zeroWord);
          value_01.schema.elementType.field_4 =
               (anon_union_8_2_eba6ea51_for_Type_5)local_ac0.reader.segment;
          value_01.schema.elementType._0_8_ = local_ac0.schema.elementType.field_4.schema;
          value_01.reader.segment = (SegmentReader *)local_ac0.reader.capTable;
          value_01.reader.capTable = (CapTableReader *)local_ac0.reader.ptr;
          value_01.reader.ptr = (byte *)local_ac0.reader._24_8_;
          value_01.reader._24_8_ = local_ac0.reader._32_8_;
          value_01.reader.structDataSize = local_ac0.reader.nestingLimit;
          value_01.reader.structPointerCount = local_ac0.reader._44_2_;
          value_01.reader.elementSize = local_ac0.reader._46_1_;
          value_01.reader._39_1_ = local_ac0.reader._47_1_;
          value_01.reader._40_8_ = in_stack_fffffffffffff2e8;
          prettyPrint(value_01);
          kj::StringTree::flatten(&local_a48,&local_a80);
          kj::StringPtr::StringPtr(&local_a30,&local_a48);
          iVar8 = (*pPVar1->_vptr_ProcessContext[5])
                            (pPVar1,local_a30.content.ptr,local_a30.content.size_);
          kj::StringTree::~StringTree(&local_a80);
        }
      }
      else {
        pPVar1 = this->context;
        DynamicValue::Reader::as<capnp::DynamicStruct>(&local_a20,(Reader *)zeroWord);
        value_00.reader.segment = (SegmentReader *)local_a20.reader.capTable;
        value_00.schema.super_Schema.raw = (Schema)(Schema)local_a20.reader.segment;
        value_00.reader.capTable = (CapTableReader *)local_a20.reader.data;
        value_00.reader.data = local_a20.reader.pointers;
        value_00.reader.pointers = (WirePointer *)local_a20.reader._32_8_;
        value_00.reader.dataSize = local_a20.reader.nestingLimit;
        value_00.reader.pointerCount = local_a20.reader._44_2_;
        value_00.reader._38_2_ = local_a20.reader._46_2_;
        value_00.reader._40_8_ = in_stack_fffffffffffff2e0;
        prettyPrint(value_00);
        kj::StringTree::flatten(&local_9b0,&local_9e8);
        kj::StringPtr::StringPtr(&local_998,&local_9b0);
        iVar8 = (*pPVar1->_vptr_ProcessContext[5])
                          (pPVar1,local_998.content.ptr,local_998.content.size_);
        kj::StringTree::~StringTree(&local_9e8);
      }
LAB_0033700d:
      SegmentArrayMessageReader::~SegmentArrayMessageReader((SegmentArrayMessageReader *)local_450);
      DynamicValue::Reader::~Reader((Reader *)zeroWord);
      kj::Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>::~Array
                ((Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> *)
                 ((long)&p.field_1 + 0x10));
      kj::parse::IteratorInput<char,_const_char_*>::~IteratorInput
                ((IteratorInput<char,_const_char_*> *)&nameParts.disposer);
      _Unwind_Resume(iVar8);
    }
    TVar6 = DynamicValue::Reader::getType((Reader *)zeroWord);
    if (TVar6 == STRUCT) {
      DynamicValue::Reader::as<capnp::DynamicStruct>
                ((ReaderFor<capnp::DynamicStruct> *)local_938,(Reader *)zeroWord);
      output._16_8_ = DynamicStruct::Reader::getSchema((Reader *)local_938);
      (this->rootType).super_Schema.raw = (RawBrandedSchema *)output._16_8_;
      kj::FdOutputStream::FdOutputStream((FdOutputStream *)local_958,1);
      DynamicStruct::Reader::operator_cast_to_Reader(&local_988,(Reader *)local_938);
      reader._reader.capTable = local_988._reader.capTable;
      reader._reader.segment = local_988._reader.segment;
      reader._reader.data = local_988._reader.data;
      reader._reader.pointers = local_988._reader.pointers;
      reader._reader.dataSize = local_988._reader.dataSize;
      reader._reader.pointerCount = local_988._reader.pointerCount;
      reader._reader._38_2_ = local_988._reader._38_2_;
      reader._reader.nestingLimit = local_988._reader.nestingLimit;
      reader._reader._44_4_ = local_988._reader._44_4_;
      writeConversion(this,reader,(OutputStream *)local_958);
      iVar8 = (*this->context->_vptr_ProcessContext[1])();
      kj::FdOutputStream::~FdOutputStream((FdOutputStream *)local_958);
      goto LAB_0033700d;
    }
    kj::MainBuilder::Validity::Validity
              (__return_storage_ptr__,"not a struct; binary output is only available on structs");
  }
  else if (bVar2) {
    local_5d0 = (ArrayPtr<const_char>)Schema::getShortDisplayName(&local_2b0);
    kj::str<char_const(&)[2],kj::StringPtr,char_const(&)[17]>
              (&local_5c0,(kj *)0x538fb3,(char (*) [2])&local_5d0,(StringPtr *)0x52835d,
               (char (*) [17])params_2);
    kj::MainBuilder::Validity::Validity(__return_storage_ptr__,&local_5c0);
    kj::String::~String(&local_5c0);
  }
  else {
    pTVar13 = kj::Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>::end
                        ((Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> *)
                         ((long)&p.field_1 + 0x10));
    if ((Tuple<kj::String,_kj::Array<unsigned_long>_> *)scopeId == pTVar13) {
      SVar22 = Schema::getShortDisplayName(&local_2b0);
      partName.content.size_ = (size_t)SVar22.content.ptr;
      kj::str<char_const(&)[2],kj::StringPtr,char_const(&)[23]>
                (&local_600,(kj *)0x538fb3,(char (*) [2])&partName.content.size_,
                 (StringPtr *)"\' cannot be evaluated.",(char (*) [23])params_2);
      kj::MainBuilder::Validity::Validity(__return_storage_ptr__,&local_600);
      kj::String::~String(&local_600);
    }
    else {
      pTVar14 = kj::get<0ul,kj::_::Tuple<kj::String,kj::Array<unsigned_long>>&>
                          ((Tuple<kj::String,_kj::Array<unsigned_long>_> *)scopeId);
      kj::str<char_const(&)[2],kj::String&,char_const(&)[18]>
                (&local_5e8,(kj *)0x538fb3,(char (*) [2])pTVar14,(String *)"\' is not defined.",
                 (char (*) [18])params_2);
      kj::MainBuilder::Validity::Validity(__return_storage_ptr__,&local_5e8);
      kj::String::~String(&local_5e8);
    }
  }
LAB_00336ff1:
  SegmentArrayMessageReader::~SegmentArrayMessageReader((SegmentArrayMessageReader *)local_450);
  DynamicValue::Reader::~Reader((Reader *)zeroWord);
LAB_0033702f:
  kj::Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>::~Array
            ((Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> *)
             ((long)&p.field_1 + 0x10));
  kj::parse::IteratorInput<char,_const_char_*>::~IteratorInput
            ((IteratorInput<char,_const_char_*> *)&nameParts.disposer);
  return __return_storage_ptr__;
}

Assistant:

kj::MainBuilder::Validity evalConst(kj::StringPtr name) {
    convertTo = formatFromDeprecatedFlags(convertTo);

    KJ_ASSERT(sourceFiles.size() == 1);

    auto parser = kj::parse::sequence(
        kj::parse::many(
            kj::parse::sequence(
                kj::parse::identifier,
                kj::parse::many(
                    kj::parse::sequence(
                        kj::parse::exactChar<'['>(),
                        kj::parse::integer,
                        kj::parse::exactChar<']'>())),
                kj::parse::oneOf(
                    kj::parse::endOfInput,
                    kj::parse::sequence(
                        kj::parse::exactChar<'.'>(),
                        kj::parse::notLookingAt(kj::parse::endOfInput))))),
        kj::parse::endOfInput);

    kj::parse::IteratorInput<char, const char*> input(name.begin(), name.end());

    kj::Array<kj::Tuple<kj::String, kj::Array<uint64_t>>> nameParts;
    KJ_IF_MAYBE(p, parser(input)) {
      nameParts = kj::mv(*p);
    } else {
      return "invalid syntax";
    }